

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchiveExplorer.h
# Opt level: O0

void __thiscall
chrono::ChArchiveExplorer::out_array_pre(ChArchiveExplorer *this,ChValue *bVal,size_t msize)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference token;
  char *string;
  value_type local_28;
  size_t local_20;
  size_t msize_local;
  ChValue *bVal_local;
  ChArchiveExplorer *this_local;
  
  if ((((this->found & 1U) == 0) || ((this->find_all & 1U) != 0)) &&
     (iVar1 = this->tablevel, local_20 = msize, msize_local = (size_t)bVal,
     bVal_local = (ChValue *)this,
     sVar3 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size(&this->search_tokens), (ulong)(long)iVar1 < sVar3)) {
    token = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](&this->search_tokens,(long)this->tablevel);
    string = ChValue::name((ChValue *)msize_local);
    bVar2 = MatchName(this,token,string);
    if ((bVar2) || (this->tablevel == 0)) {
      this->found_obj = true;
      iVar1 = this->tablevel;
      sVar3 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->search_tokens);
      if ((long)(iVar1 + 1) == sVar3) {
        local_28 = (value_type)(**(code **)(*(long *)msize_local + 0x10))();
        std::vector<chrono::ChValue_*,_std::allocator<chrono::ChValue_*>_>::push_back
                  (&this->results,&local_28);
        this->found = true;
      }
      this->tablevel = this->tablevel + 1;
      std::vector<bool,_std::allocator<bool>_>::push_back(&this->in_array,true);
    }
  }
  return;
}

Assistant:

virtual void out_array_pre (ChValue& bVal, size_t msize) {
            if (this->found && !this->find_all) return;
            if (this->tablevel >= this->search_tokens.size()) return;

            if (this->MatchName(search_tokens[this->tablevel], bVal.name()) || tablevel==0) {
                this->found_obj = true;
                
                if (this->tablevel +1 == this->search_tokens.size()) {
                    this->results.push_back(bVal.new_clone());
                    this->found = true;
                } 
                ++tablevel;
                in_array.push_back(true);
            }  
      }